

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipeline.cpp
# Opt level: O0

void rw::uninstV3d(int type,V3d *dst,uint8 *src,uint32 numVertices,uint32 stride)

{
  uint uVar1;
  uint local_40;
  uint local_3c;
  int32 normal [3];
  uint32 n;
  uint32 i_1;
  uint32 i;
  uint32 stride_local;
  uint32 numVertices_local;
  uint8 *src_local;
  V3d *dst_local;
  int type_local;
  
  _stride_local = (uint *)src;
  src_local = (uint8 *)dst;
  if (type == 8) {
    for (n = 0; n < numVertices; n = n + 1) {
      *(undefined8 *)src_local = *(undefined8 *)_stride_local;
      *(undefined4 *)(src_local + 8) = *(undefined4 *)((long)_stride_local + 8);
      _stride_local = (uint *)((long)_stride_local + (ulong)stride);
      src_local = src_local + 0xc;
    }
  }
  else if (type == 0xc) {
    for (normal[2] = 0; (uint)normal[2] < numVertices; normal[2] = normal[2] + 1) {
      uVar1 = *_stride_local;
      local_40 = uVar1 & 0x7ff;
      local_3c = uVar1 >> 0xb & 0x7ff;
      normal[0] = uVar1 >> 0x16;
      if ((uVar1 & 0x400) != 0) {
        local_40 = local_40 | 0xfffff800;
      }
      if ((uVar1 >> 0xb & 0x400) != 0) {
        local_3c = local_3c | 0xfffff800;
      }
      if ((normal[0] & 0x200U) != 0) {
        normal[0] = normal[0] | 0xfffffc00;
      }
      *(float *)src_local = (float)(int)local_40 / 1023.0;
      *(float *)(src_local + 4) = (float)(int)local_3c / 1023.0;
      *(float *)(src_local + 8) = (float)normal[0] / 511.0;
      _stride_local = (uint *)((long)_stride_local + (ulong)stride);
      src_local = src_local + 0xc;
    }
  }
  return;
}

Assistant:

void
uninstV3d(int type, V3d *dst, uint8 *src, uint32 numVertices, uint32 stride)
{
	if(type == VERT_FLOAT3)
		for(uint32 i = 0; i < numVertices; i++){
			memcpy(dst, src, 12);
			src += stride;
			dst++;
		}
	else if(type == VERT_COMPNORM)
		for(uint32 i = 0; i < numVertices; i++){
			uint32 n = *(uint32*)src;
			int32 normal[3];
			normal[0] = n & 0x7FF;
			normal[1] = (n >> 11) & 0x7FF;
			normal[2] = (n >> 22) & 0x3FF;
			// sign extend
			if(normal[0] & 0x400) normal[0] |= ~0x7FF;
			if(normal[1] & 0x400) normal[1] |= ~0x7FF;
			if(normal[2] & 0x200) normal[2] |= ~0x3FF;
			dst->x = normal[0] / 1023.0f;
			dst->y = normal[1] / 1023.0f;
			dst->z = normal[2] / 511.0f;
			src += stride;
			dst++;
		}
	else
		assert(0 && "unsupported uninstV3d type");
}